

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  byte bVar1;
  cmListFileBacktrace local_e0;
  Directory local_90;
  undefined1 local_68 [8];
  cmListFileBacktrace lfbt;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmMakefile *this_local;
  
  lfbt.Snapshot.Position.Position._7_1_ = asString;
  GetBacktrace((cmListFileBacktrace *)local_68,this);
  cmState::Snapshot::GetDirectory(&local_90,&this->StateSnapshot);
  bVar1 = lfbt.Snapshot.Position.Position._7_1_;
  cmListFileBacktrace::cmListFileBacktrace(&local_e0,(cmListFileBacktrace *)local_68);
  cmState::Directory::AppendProperty(&local_90,prop,value,(bool)(bVar1 & 1),&local_e0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_e0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_68);
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop,
                                const char* value,
                                bool asString)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  this->StateSnapshot.GetDirectory().AppendProperty(prop, value,
                                                    asString, lfbt);
}